

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O3

int CVmObjBigNum::compute_eq_exact(char *ext1,char *ext2)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  ushort uVar8;
  char *pcVar9;
  ulong uVar10;
  
  if (((ext1[4] & 6U) == 0) && ((ext2[4] & 6U) == 0)) {
    uVar1 = *(ushort *)ext1;
    uVar2 = *(ushort *)ext2;
    uVar8 = uVar1;
    if (uVar1 < uVar2) {
      uVar8 = uVar2;
    }
    pcVar9 = (char *)0x0;
    uVar3 = uVar2;
    if (uVar1 < uVar2) {
      pcVar9 = ext2;
      uVar3 = uVar1;
    }
    if (uVar2 < uVar1) {
      pcVar9 = ext1;
    }
    if ((((ext2[4] ^ ext1[4]) & 1U) == 0) && (*(short *)(ext1 + 2) == *(short *)(ext2 + 2))) {
      uVar4 = (uint)uVar3;
      uVar5 = (ulong)uVar4;
      if (uVar4 != 0) {
        uVar10 = 0;
        bVar6 = 0;
        do {
          if (((byte)(ext2[(uVar10 >> 1) + 5] ^ ext1[(uVar10 >> 1) + 5]) >> (~bVar6 & 4) & 0xf) != 0
             ) {
            return 0;
          }
          uVar10 = uVar10 + 1;
          bVar6 = bVar6 + 4;
        } while (uVar5 != uVar10);
      }
      if ((pcVar9 != (char *)0x0) && (uVar3 < uVar8)) {
        iVar7 = uVar4 * 4;
        do {
          if (((byte)pcVar9[(uVar5 >> 1) + 5] >> (~(byte)iVar7 & 4) & 0xf) != 0) {
            return 0;
          }
          uVar5 = uVar5 + 1;
          iVar7 = iVar7 + 4;
        } while (uVar8 != uVar5);
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

static int get_type(const char *ext)
        { return ext[VMBN_FLAGS] & VMBN_F_TYPE_MASK; }